

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_avx2_256_8.c
# Opt level: O1

parasail_result_t *
parasail_nw_rowcol_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  longlong *plVar1;
  __m256i alVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  undefined1 auVar6 [32];
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  longlong lVar19;
  longlong lVar20;
  char cVar21;
  int iVar22;
  parasail_result_t *ppVar23;
  __m256i *ptr;
  __m256i *palVar24;
  __m256i *ptr_00;
  int8_t *ptr_01;
  char cVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  int8_t iVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  int iVar39;
  ulong size;
  int iVar40;
  int iVar41;
  __m256i *palVar42;
  bool bVar43;
  undefined1 uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  __m256i_8_t e;
  __m256i_8_t h;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  undefined1 auVar46 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_rowcol_striped_profile_avx2_256_8_cold_8();
  }
  else {
    pvVar3 = (profile->profile8).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_rowcol_striped_profile_avx2_256_8_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_rowcol_striped_profile_avx2_256_8_cold_6();
      }
      else {
        uVar32 = profile->s1Len;
        if ((int)uVar32 < 1) {
          parasail_nw_rowcol_striped_profile_avx2_256_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_rowcol_striped_profile_avx2_256_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_rowcol_striped_profile_avx2_256_8_cold_3();
        }
        else if (open < 0) {
          parasail_nw_rowcol_striped_profile_avx2_256_8_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_rowcol_striped_profile_avx2_256_8_cold_1();
        }
        else {
          iVar41 = uVar32 - 1;
          size = (ulong)uVar32 + 0x1f >> 5;
          iVar39 = (int)size;
          iVar22 = iVar41 / iVar39;
          iVar26 = ppVar4->min;
          iVar40 = -open;
          uVar31 = (uint)(byte)-(char)iVar26;
          if (iVar26 != iVar40 && SBORROW4(iVar26,iVar40) == iVar26 + open < 0) {
            uVar31 = open;
          }
          cVar21 = '~' - (char)ppVar4->max;
          ppVar23 = parasail_result_new_rowcol1((uint)((ulong)uVar32 + 0x1f) & 0x7fffffe0,s2Len);
          if (ppVar23 != (parasail_result_t *)0x0) {
            ppVar23->flag = ppVar23->flag | 0x20140801;
            ptr = parasail_memalign___m256i(0x20,size);
            palVar24 = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign_int8_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_01 != (int8_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                (palVar24 != (__m256i *)0x0 && ptr != (__m256i *)0x0)) {
              iVar26 = s2Len + -1;
              iVar27 = 0x1f - iVar22;
              uVar44 = (undefined1)open;
              auVar50[1] = uVar44;
              auVar50[0] = uVar44;
              auVar50[2] = uVar44;
              auVar50[3] = uVar44;
              auVar50[4] = uVar44;
              auVar50[5] = uVar44;
              auVar50[6] = uVar44;
              auVar50[7] = uVar44;
              auVar50[8] = uVar44;
              auVar50[9] = uVar44;
              auVar50[10] = uVar44;
              auVar50[0xb] = uVar44;
              auVar50[0xc] = uVar44;
              auVar50[0xd] = uVar44;
              auVar50[0xe] = uVar44;
              auVar50[0xf] = uVar44;
              auVar50[0x10] = uVar44;
              auVar50[0x11] = uVar44;
              auVar50[0x12] = uVar44;
              auVar50[0x13] = uVar44;
              auVar50[0x14] = uVar44;
              auVar50[0x15] = uVar44;
              auVar50[0x16] = uVar44;
              auVar50[0x17] = uVar44;
              auVar50[0x18] = uVar44;
              auVar50[0x19] = uVar44;
              auVar50[0x1a] = uVar44;
              auVar50[0x1b] = uVar44;
              auVar50[0x1c] = uVar44;
              auVar50[0x1d] = uVar44;
              auVar50[0x1e] = uVar44;
              auVar50[0x1f] = uVar44;
              uVar44 = (undefined1)gap;
              auVar51[1] = uVar44;
              auVar51[0] = uVar44;
              auVar51[2] = uVar44;
              auVar51[3] = uVar44;
              auVar51[4] = uVar44;
              auVar51[5] = uVar44;
              auVar51[6] = uVar44;
              auVar51[7] = uVar44;
              auVar51[8] = uVar44;
              auVar51[9] = uVar44;
              auVar51[10] = uVar44;
              auVar51[0xb] = uVar44;
              auVar51[0xc] = uVar44;
              auVar51[0xd] = uVar44;
              auVar51[0xe] = uVar44;
              auVar51[0xf] = uVar44;
              auVar51[0x10] = uVar44;
              auVar51[0x11] = uVar44;
              auVar51[0x12] = uVar44;
              auVar51[0x13] = uVar44;
              auVar51[0x14] = uVar44;
              auVar51[0x15] = uVar44;
              auVar51[0x16] = uVar44;
              auVar51[0x17] = uVar44;
              auVar51[0x18] = uVar44;
              auVar51[0x19] = uVar44;
              auVar51[0x1a] = uVar44;
              auVar51[0x1b] = uVar44;
              auVar51[0x1c] = uVar44;
              auVar51[0x1d] = uVar44;
              auVar51[0x1e] = uVar44;
              auVar51[0x1f] = uVar44;
              cVar25 = (char)uVar31 + -0x7f;
              auVar45[1] = cVar25;
              auVar45[0] = cVar25;
              auVar45[2] = cVar25;
              auVar45[3] = cVar25;
              auVar45[4] = cVar25;
              auVar45[5] = cVar25;
              auVar45[6] = cVar25;
              auVar45[7] = cVar25;
              auVar45[8] = cVar25;
              auVar45[9] = cVar25;
              auVar45[10] = cVar25;
              auVar45[0xb] = cVar25;
              auVar45[0xc] = cVar25;
              auVar45[0xd] = cVar25;
              auVar45[0xe] = cVar25;
              auVar45[0xf] = cVar25;
              auVar46[0x10] = cVar25;
              auVar46._0_16_ = auVar45;
              auVar46[0x11] = cVar25;
              auVar46[0x12] = cVar25;
              auVar46[0x13] = cVar25;
              auVar46[0x14] = cVar25;
              auVar46[0x15] = cVar25;
              auVar46[0x16] = cVar25;
              auVar46[0x17] = cVar25;
              auVar46[0x18] = cVar25;
              auVar46[0x19] = cVar25;
              auVar46[0x1a] = cVar25;
              auVar46[0x1b] = cVar25;
              auVar46[0x1c] = cVar25;
              auVar46[0x1d] = cVar25;
              auVar46[0x1e] = cVar25;
              auVar46[0x1f] = cVar25;
              auVar47[1] = cVar21;
              auVar47[0] = cVar21;
              auVar47[2] = cVar21;
              auVar47[3] = cVar21;
              auVar47[4] = cVar21;
              auVar47[5] = cVar21;
              auVar47[6] = cVar21;
              auVar47[7] = cVar21;
              auVar47[8] = cVar21;
              auVar47[9] = cVar21;
              auVar47[10] = cVar21;
              auVar47[0xb] = cVar21;
              auVar47[0xc] = cVar21;
              auVar47[0xd] = cVar21;
              auVar47[0xe] = cVar21;
              auVar47[0xf] = cVar21;
              auVar47[0x10] = cVar21;
              auVar47[0x11] = cVar21;
              auVar47[0x12] = cVar21;
              auVar47[0x13] = cVar21;
              auVar47[0x14] = cVar21;
              auVar47[0x15] = cVar21;
              auVar47[0x16] = cVar21;
              auVar47[0x17] = cVar21;
              auVar47[0x18] = cVar21;
              auVar47[0x19] = cVar21;
              auVar47[0x1a] = cVar21;
              auVar47[0x1b] = cVar21;
              auVar47[0x1c] = cVar21;
              auVar47[0x1d] = cVar21;
              auVar47[0x1e] = cVar21;
              auVar47[0x1f] = cVar21;
              lVar35 = (long)iVar40;
              uVar37 = 0;
              do {
                lVar29 = 0;
                lVar38 = lVar35;
                do {
                  uVar44 = 0x80;
                  if (-0x80 < lVar38) {
                    uVar44 = (undefined1)lVar38;
                  }
                  *(undefined1 *)((long)&local_80 + lVar29) = uVar44;
                  lVar33 = lVar38 - (ulong)(uint)open;
                  if (lVar33 < -0x7f) {
                    lVar33 = -0x80;
                  }
                  *(char *)((long)&local_a0 + lVar29) = (char)lVar33;
                  lVar29 = lVar29 + 1;
                  lVar38 = lVar38 - size * (uint)gap;
                } while (lVar29 != 0x20);
                palVar42 = ptr + uVar37;
                (*palVar42)[0] = local_80;
                (*palVar42)[1] = lStack_78;
                (*palVar42)[2] = lStack_70;
                (*palVar42)[3] = lStack_68;
                palVar42 = ptr_00 + uVar37;
                (*palVar42)[0] = local_a0;
                (*palVar42)[1] = lStack_98;
                (*palVar42)[2] = lStack_90;
                (*palVar42)[3] = lStack_88;
                uVar37 = uVar37 + 1;
                lVar35 = lVar35 - (ulong)(uint)gap;
              } while (uVar37 != size);
              *ptr_01 = '\0';
              uVar37 = 1;
              if (1 < s2Len) {
                uVar37 = (ulong)(uint)s2Len;
              }
              uVar30 = 0;
              do {
                iVar34 = -0x80;
                if (-0x80 < iVar40) {
                  iVar34 = (int8_t)iVar40;
                }
                ptr_01[uVar30 + 1] = iVar34;
                iVar40 = iVar40 - gap;
                uVar30 = uVar30 + 1;
              } while (uVar37 != uVar30);
              iVar40 = 1;
              if (1 < iVar27) {
                iVar40 = iVar27;
              }
              uVar37 = 1;
              if (1 < s2Len) {
                uVar37 = (ulong)(uint)s2Len;
              }
              lVar35 = (ulong)(iVar39 + (uint)(iVar39 == 0)) << 5;
              uVar30 = 0;
              auVar48 = ZEXT3264(auVar46);
              auVar49 = ZEXT3264(auVar47);
              do {
                palVar42 = ptr;
                ptr = palVar24;
                iVar28 = ppVar4->mapper[(byte)s2[uVar30]];
                auVar52 = SUB3216(palVar42[iVar39 - 1],0);
                auVar55._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar45;
                auVar55._16_16_ = ZEXT116(0) * auVar46._16_16_ + ZEXT116(1) * auVar52;
                auVar55 = vpalignr_avx2((undefined1  [32])palVar42[iVar39 - 1],auVar55,0xf);
                auVar52 = vpinsrb_avx(auVar55._0_16_,(uint)(byte)ptr_01[uVar30],0);
                auVar55 = vpblendd_avx2(auVar55,ZEXT1632(auVar52),0xf);
                lVar38 = 0;
                auVar54 = ZEXT3264(auVar46);
                do {
                  auVar56 = vpaddsb_avx2(auVar55,*(undefined1 (*) [32])
                                                  ((long)pvVar3 +
                                                  lVar38 + size * (long)iVar28 * 0x20));
                  auVar55 = *(undefined1 (*) [32])((long)*ptr_00 + lVar38);
                  auVar53 = auVar54._0_32_;
                  auVar6 = vpmaxsb_avx2(auVar55,auVar53);
                  auVar56 = vpmaxsb_avx2(auVar56,auVar6);
                  *(undefined1 (*) [32])((long)*ptr + lVar38) = auVar56;
                  auVar6 = vpmaxsb_avx2(auVar48._0_32_,auVar56);
                  auVar48 = ZEXT3264(auVar6);
                  auVar6 = vpminsb_avx2(auVar49._0_32_,auVar55);
                  auVar6 = vpminsb_avx2(auVar6,auVar53);
                  auVar6 = vpminsb_avx2(auVar6,auVar56);
                  auVar49 = ZEXT3264(auVar6);
                  auVar56 = vpsubsb_avx2(auVar56,auVar50);
                  auVar55 = vpsubsb_avx2(auVar55,auVar51);
                  auVar55 = vpmaxsb_avx2(auVar55,auVar56);
                  *(undefined1 (*) [32])((long)*ptr_00 + lVar38) = auVar55;
                  auVar55 = vpsubsb_avx2(auVar53,auVar51);
                  auVar55 = vpmaxsb_avx2(auVar55,auVar56);
                  auVar54 = ZEXT3264(auVar55);
                  auVar55 = *(undefined1 (*) [32])((long)*palVar42 + lVar38);
                  lVar38 = lVar38 + 0x20;
                } while (lVar35 != lVar38);
                uVar32 = 0;
                do {
                  auVar56._0_16_ = ZEXT116(0) * auVar54._0_16_ + ZEXT116(1) * auVar45;
                  auVar56._16_16_ = ZEXT116(0) * auVar46._16_16_ + ZEXT116(1) * auVar54._0_16_;
                  auVar55 = vpalignr_avx2(auVar54._0_32_,auVar56,0xf);
                  iVar28 = ptr_01[uVar30 + 1] - open;
                  if (iVar28 < -0x7f) {
                    iVar28 = -0x80;
                  }
                  auVar52 = vpinsrb_avx(auVar55._0_16_,iVar28,0);
                  auVar55 = vpblendd_avx2(auVar55,ZEXT1632(auVar52),0xf);
                  auVar54 = ZEXT3264(auVar55);
                  bVar43 = true;
                  uVar36 = 1;
                  lVar38 = 0;
                  do {
                    auVar55 = vpmaxsb_avx2(auVar54._0_32_,
                                           *(undefined1 (*) [32])((long)*ptr + lVar38));
                    *(undefined1 (*) [32])((long)*ptr + lVar38) = auVar55;
                    auVar6 = vpminsb_avx2(auVar49._0_32_,auVar55);
                    auVar49 = ZEXT3264(auVar6);
                    auVar56 = vpmaxsb_avx2(auVar48._0_32_,auVar55);
                    auVar48 = ZEXT3264(auVar56);
                    auVar55 = vpsubsb_avx2(auVar55,auVar50);
                    auVar53 = vpsubsb_avx2(auVar54._0_32_,auVar51);
                    auVar54 = ZEXT3264(auVar53);
                    auVar55 = vpcmpgtb_avx2(auVar53,auVar55);
                    if ((((((((((((((((((((((((((((((((auVar55 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar55 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar55 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar55 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar55 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar55 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar55 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar55 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar55 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar55 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar55 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar55 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar55 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar55 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar55 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar55 >> 0x7f,0) == '\0')
                                      && (auVar55 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar55 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar55 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar55 >> 0x9f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar55 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar55 >> 0xaf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar55 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar55 >> 0xbf,0) == '\0') &&
                              (auVar55 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar55 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar55 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar55 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar55 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar55 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar55 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar55[0x1f]) break;
                    bVar43 = uVar36 < size;
                    lVar38 = lVar38 + 0x20;
                    uVar36 = uVar36 + 1;
                  } while (lVar35 != lVar38);
                } while ((!bVar43) && (bVar43 = uVar32 < 0x1f, uVar32 = uVar32 + 1, bVar43));
                alVar2 = ptr[(uint)(iVar41 % iVar39)];
                cVar21 = alVar2[2]._7_1_;
                iVar28 = iVar40;
                if (iVar22 < 0x1f) {
                  do {
                    auVar55 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28
                                             );
                    alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar55,0xf);
                    cVar21 = alVar2[2]._7_1_;
                    iVar28 = iVar28 + -1;
                  } while (iVar28 != 0);
                }
                ((ppVar23->field_4).rowcols)->score_row[uVar30] = (int)cVar21;
                uVar30 = uVar30 + 1;
                palVar24 = palVar42;
                if (uVar30 == uVar37) {
                  uVar30 = (ulong)(uint)(iVar39 * 4);
                  uVar37 = 0;
                  do {
                    piVar5 = ((ppVar23->field_4).rowcols)->score_col;
                    plVar1 = *ptr + uVar37;
                    lVar19 = *plVar1;
                    cVar21 = *(char *)((long)plVar1 + 1);
                    cVar25 = *(char *)((long)plVar1 + 2);
                    cVar7 = *(char *)((long)plVar1 + 3);
                    cVar8 = *(char *)((long)plVar1 + 4);
                    cVar9 = *(char *)((long)plVar1 + 5);
                    cVar10 = *(char *)((long)plVar1 + 6);
                    cVar11 = *(char *)((long)plVar1 + 7);
                    plVar1 = *ptr + uVar37 + 2;
                    lVar20 = *plVar1;
                    cVar12 = *(char *)((long)plVar1 + 1);
                    cVar13 = *(char *)((long)plVar1 + 2);
                    cVar14 = *(char *)((long)plVar1 + 3);
                    cVar15 = *(char *)((long)plVar1 + 4);
                    cVar16 = *(char *)((long)plVar1 + 5);
                    cVar17 = *(char *)((long)plVar1 + 6);
                    cVar18 = *(char *)((long)plVar1 + 7);
                    *(int *)((long)piVar5 + uVar37) = (int)(char)lVar19;
                    *(int *)((long)piVar5 + uVar30 + uVar37) = (int)cVar21;
                    *(int *)((long)piVar5 + (uint)(iVar39 * 8) + uVar37) = (int)cVar25;
                    *(int *)((long)piVar5 + uVar30 * 3 + uVar37) = (int)cVar7;
                    *(int *)((long)piVar5 + (uint)(iVar39 << 4) + uVar37) = (int)cVar8;
                    *(int *)((long)piVar5 + uVar30 * 5 + uVar37) = (int)cVar9;
                    *(int *)((long)piVar5 + (ulong)(uint)(iVar39 * 8) * 3 + uVar37) = (int)cVar10;
                    *(int *)((long)piVar5 + size * 0x1c + uVar37) = (int)cVar11;
                    *(int *)((long)piVar5 + size * 0x20 + uVar37) = (int)(char)lVar19;
                    *(int *)((long)piVar5 + (ulong)(uint)(iVar39 * 4) * 9 + uVar37) = (int)cVar21;
                    *(int *)((long)piVar5 + (ulong)(uint)(iVar39 * 8) * 5 + uVar37) = (int)cVar25;
                    *(int *)((long)piVar5 + size * 0x2c + uVar37) = (int)cVar7;
                    *(int *)((long)piVar5 + (ulong)(uint)(iVar39 << 4) * 3 + uVar37) = (int)cVar8;
                    *(int *)((long)piVar5 + size * 0x34 + uVar37) = (int)cVar9;
                    *(int *)((long)piVar5 + size * 0x38 + uVar37) = (int)cVar10;
                    *(int *)((long)piVar5 + size * 0x3c + uVar37) = (int)cVar11;
                    *(int *)((long)piVar5 + size * 0x40 + uVar37) = (int)(char)lVar20;
                    *(int *)((long)piVar5 + size * 0x40 + (ulong)(uint)(iVar39 * 4) + uVar37) =
                         (int)cVar12;
                    *(int *)((long)piVar5 + (ulong)(uint)(iVar39 * 8) * 9 + uVar37) = (int)cVar13;
                    *(int *)((long)piVar5 + size * 0x4c + uVar37) = (int)cVar14;
                    *(int *)((long)piVar5 + (ulong)(uint)(iVar39 << 4) * 5 + uVar37) = (int)cVar15;
                    *(int *)((long)piVar5 + size * 0x54 + uVar37) = (int)cVar16;
                    *(int *)((long)piVar5 + size * 0x58 + uVar37) = (int)cVar17;
                    *(int *)((long)piVar5 + size * 0x5c + uVar37) = (int)cVar18;
                    *(int *)((long)piVar5 + size * 0x60 + uVar37) = (int)(char)lVar20;
                    *(int *)((long)piVar5 + size * 100 + uVar37) = (int)cVar12;
                    *(int *)((long)piVar5 + size * 0x68 + uVar37) = (int)cVar13;
                    *(int *)((long)piVar5 + size * 0x6c + uVar37) = (int)cVar14;
                    *(int *)((long)piVar5 + size * 0x70 + uVar37) = (int)cVar15;
                    *(int *)((long)piVar5 + size * 0x74 + uVar37) = (int)cVar16;
                    *(int *)((long)piVar5 + size * 0x78 + uVar37) = (int)cVar17;
                    *(int *)((long)piVar5 + size * 0x7c + uVar37) = (int)cVar18;
                    uVar37 = uVar37 + 4;
                  } while ((iVar39 + (uint)(iVar39 == 0)) * 4 != uVar37);
                  alVar2 = ptr[(uint)(iVar41 % iVar39)];
                  cVar21 = alVar2[2]._7_1_;
                  if (iVar22 < 0x1f) {
                    iVar22 = 1;
                    if (1 < iVar27) {
                      iVar22 = iVar27;
                    }
                    do {
                      auVar50 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,
                                                0x28);
                      alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar50,0xf);
                      cVar21 = alVar2[2]._7_1_;
                      iVar22 = iVar22 + -1;
                    } while (iVar22 != 0);
                  }
                  auVar46 = vpcmpgtb_avx2(auVar46,auVar6);
                  auVar47 = vpcmpgtb_avx2(auVar56,auVar47);
                  auVar46 = vpor_avx2(auVar47,auVar46);
                  if ((((((((((((((((((((((((((((((((auVar46 >> 7 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0 ||
                                                   (auVar46 >> 0xf & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar46 >> 0x17 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar46 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar46 >> 0x27 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar46 >> 0x2f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar46 >> 0x37 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar46 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar46 >> 0x47 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar46 >> 0x4f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar46 >> 0x57 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar46 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar46 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar46 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar46 >> 0x77 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar46 >> 0x7f,0) != '\0')
                                    || (auVar46 >> 0x87 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                   (auVar46 >> 0x8f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar46 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar46 >> 0x9f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar46 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar46 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar46 >> 0xb7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar46 >> 0xbf,0) != '\0') ||
                            (auVar46 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar46 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar46 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar46 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar46 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar46 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar46 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      auVar46[0x1f] < '\0') {
                    *(byte *)&ppVar23->flag = (byte)ppVar23->flag | 0x40;
                    cVar21 = '\0';
                    iVar26 = 0;
                    iVar41 = 0;
                  }
                  ppVar23->score = (int)cVar21;
                  ppVar23->end_query = iVar41;
                  ppVar23->end_ref = iVar26;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(palVar42);
                  parasail_free(ptr);
                  return ppVar23;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            __m256i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 1);
        }
        score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}